

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_set_max_frame_size(OPEN_HANDLE open,uint32_t max_frame_size_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE max_frame_size_amqp_value;
  OPEN_INSTANCE *open_instance;
  int result;
  uint32_t max_frame_size_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._0_4_ = 0x538;
  }
  else {
    item_value = amqpvalue_create_uint(max_frame_size_value);
    if (item_value == (AMQP_VALUE)0x0) {
      open_instance._0_4_ = 0x540;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,2,item_value);
      if (iVar1 == 0) {
        open_instance._0_4_ = 0;
      }
      else {
        open_instance._0_4_ = 0x546;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)open_instance;
}

Assistant:

int open_set_max_frame_size(OPEN_HANDLE open, uint32_t max_frame_size_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE max_frame_size_amqp_value = amqpvalue_create_uint(max_frame_size_value);
        if (max_frame_size_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 2, max_frame_size_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(max_frame_size_amqp_value);
        }
    }

    return result;
}